

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,
          eq_<unsigned_long,_boost::ext::ut::v1_1_8::detail::integral_constant<0UL>_> *op)

{
  undefined1 *puVar1;
  printer *ppVar2;
  string_view local_28;
  
  local_28 = color(this,op->value_);
  ppVar2 = operator<<(this,&local_28);
  puVar1 = &ppVar2->field_0x40;
  std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
  std::operator<<((ostream *)puVar1," == ");
  std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
  ppVar2 = operator<<(ppVar2,(basic_string_view<char,_std::char_traits<char>_> *)this);
  return ppVar2;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }